

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateServiceFile
               (FileDescriptor *file,ServiceDescriptor *service,bool is_descriptor,
               GeneratorContext *generator_context)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  long lVar3;
  long lVar4;
  string fullname;
  string filename;
  Printer printer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  Printer local_d0;
  ZeroCopyOutputStream *output;
  
  GeneratedServiceFileName_abi_cxx11_
            (&local_f0,(php *)service,
             (ServiceDescriptor *)CONCAT71(in_register_00000011,is_descriptor),
             SUB81(generator_context,0));
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_f0);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&local_d0,output,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_d0,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  FilenameToClassname(&local_110,&local_f0);
  iVar2 = std::__cxx11::string::find_last_of((char *)&local_110,0x39171d,0xffffffffffffffff);
  if (*(long *)(*(long *)(*(long *)(file + 0x88) + 0x80) + 8) == 0) {
    if ((*(byte *)(*(long *)(file + 0x88) + 0x28) & 0x80) == 0) {
      if ((iVar2 == -1) && (*(long *)(*(long *)(file + 8) + 8) == 0)) goto LAB_0026ffa1;
    }
    else if (iVar2 == -1) goto LAB_0026ffa1;
  }
  std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_110);
  io::Printer::Print<char[5],std::__cxx11::string>
            (&local_d0,"namespace ^name^;\n\n",(char (*) [5])0x3918cc,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_0026ffa1:
  GenerateServiceDocComment(&local_d0,service);
  if (iVar2 == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_d0,"interface ^name^\n{\n",(char (*) [5])0x3918cc,&local_110);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_110);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_d0,"interface ^name^\n{\n",(char (*) [5])0x3918cc,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  io::Printer::Indent(&local_d0);
  io::Printer::Indent(&local_d0);
  if (0 < *(int *)(service + 0x28)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)(service + 0x20);
      GenerateServiceMethodDocComment(&local_d0,(MethodDescriptor *)(lVar1 + lVar4));
      GenerateServiceMethod((MethodDescriptor *)(lVar1 + lVar4),&local_d0);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x68;
    } while (lVar3 < *(int *)(service + 0x28));
  }
  io::Printer::Outdent(&local_d0);
  io::Printer::Outdent(&local_d0);
  io::Printer::Print<>(&local_d0,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  io::Printer::~Printer(&local_d0);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateServiceFile(const FileDescriptor* file,
  const ServiceDescriptor* service, bool is_descriptor,
  GeneratorContext* generator_context) {
  std::string filename = GeneratedServiceFileName(service, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->options().php_namespace().empty() ||
      (!file->options().has_php_namespace() && !file->package().empty()) ||
      lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateServiceDocComment(&printer, service);

  if (lastindex != string::npos) {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
      printer.Print(
        "interface ^name^\n"
        "{\n",
        "name", fullname);
  }

  Indent(&printer);

  for (int i = 0; i < service->method_count(); i++) {
    const MethodDescriptor* method = service->method(i);
    GenerateServiceMethodDocComment(&printer, method);
    GenerateServiceMethod(method, &printer);
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}